

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O0

void __thiscall
CryptoUtil_HmacSha256BlindKey_Test::~CryptoUtil_HmacSha256BlindKey_Test
          (CryptoUtil_HmacSha256BlindKey_Test *this)

{
  CryptoUtil_HmacSha256BlindKey_Test *this_local;
  
  ~CryptoUtil_HmacSha256BlindKey_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CryptoUtil, HmacSha256BlindKey) {
  ByteData key(
      "10844437907de6b5f9886df4345ad76c8c83b3abaa2220843a899d743ada3fd2");
  std::vector<uint8_t> bdata(7);
  std::string abf = "VBF";
  uint32_t zero = 0;
  memcpy(bdata.data(), abf.data(), 3);
  memcpy(bdata.data()+3, &zero, 4);
  ByteData data(bdata);
  ByteData256 byte_data = CryptoUtil::HmacSha256(key.GetBytes(), data);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "ee3f40bae5cd1c127bd6ac7c1626b99243c57800471ceb5b4e95e6ec7f3fc88d");
}